

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

int __thiscall ON_wString::ReverseFind(ON_wString *this,wchar_t c)

{
  wchar_t *pwVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ON_Internal_Empty_wString *pOVar5;
  
  iVar2 = ON_IsValidSingleElementWideCharValue(c);
  if (iVar2 == 0) {
LAB_00673830:
    uVar3 = 0xffffffff;
  }
  else {
    pwVar1 = this->m_s;
    pOVar5 = &empty_wstring;
    if (pwVar1 != (wchar_t *)0x0) {
      pOVar5 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
    }
    uVar3 = (pOVar5->header).string_length;
    uVar4 = uVar3;
    do {
      uVar4 = uVar4 - 1;
      if ((int)uVar3 < 1) goto LAB_00673830;
      uVar3 = uVar3 - 1;
    } while (pwVar1[uVar4] != c);
  }
  return uVar3;
}

Assistant:

int ON_wString::ReverseFind( wchar_t c ) const
{
  if (ON_IsValidSingleElementWideCharValue(c))
  {
    // find first single character
    int i = Length();
    while( i > 0 )
    {
      if (c == m_s[--i])
        return i;
    }
  }
  return -1;
}